

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_suite.hpp
# Opt level: O2

string * __thiscall
iutest::TestSuite::testsuite_name_with_where_abi_cxx11_
          (string *__return_storage_ptr__,TestSuite *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_testsuite_name);
  iVar1 = (*this->_vptr_TestSuite[2])(this);
  if (CONCAT44(extraout_var,iVar1) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    (*this->_vptr_TestSuite[2])(this);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

::std::string testsuite_name_with_where() const
    {
        ::std::string str = m_testsuite_name;
        if( type_param() != NULL )
        {
            str += ", where TypeParam = ";
            str += type_param();
        }
        return str;
    }